

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

errr finish_parse_monster(parser *p)

{
  ulong uVar1;
  monster_race *pmVar2;
  ushort uVar3;
  undefined8 *puVar4;
  monster_blow *pmVar5;
  blow_method_conflict *pbVar6;
  blow_effect_conflict *pbVar7;
  long lVar8;
  long lVar9;
  monster_lore *pmVar10;
  uint16_t uVar11;
  wchar_t wVar12;
  undefined8 *puVar13;
  monster_blow *pmVar14;
  angband_constants *paVar15;
  void *pvVar16;
  monster_race *pmVar17;
  long *plVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  undefined8 *puVar22;
  monster_blow *pmVar23;
  undefined8 *p_00;
  monster_friends *pmVar24;
  monster_shape *pmVar25;
  
  paVar15 = z_info;
  z_info->r_max = 0;
  paVar15->mon_blows_max = 0;
  puVar13 = (undefined8 *)parser_priv(p);
  paVar15 = z_info;
  for (; puVar13 != (undefined8 *)0x0; puVar13 = (undefined8 *)*puVar13) {
    puVar22 = (undefined8 *)puVar13[0xf];
    paVar15->r_max = paVar15->r_max + 1;
    uVar19 = 0;
    for (; puVar22 != (undefined8 *)0x0; puVar22 = (undefined8 *)*puVar22) {
      uVar19 = uVar19 + 1;
    }
    if (paVar15->mon_blows_max < uVar19) {
      paVar15->mon_blows_max = (uint16_t)uVar19;
    }
  }
  r_info = (monster_race *)mem_zalloc((ulong)paVar15->r_max * 0xd0 + 0xd0);
  uVar3 = z_info->r_max;
  puVar13 = (undefined8 *)parser_priv(p);
  uVar20 = (ulong)uVar3;
  do {
    pmVar2 = r_info;
    if (puVar13 == (undefined8 *)0x0) {
      uVar11 = z_info->r_max + 1;
      z_info->r_max = uVar11;
      for (uVar20 = 0; uVar20 < uVar11; uVar20 = uVar20 + 1) {
        pmVar2 = r_info + uVar20;
        pmVar24 = (monster_friends *)&r_info[uVar20].friends;
        while (pmVar24 = pmVar24->next, pmVar24 != (monster_friends *)0x0) {
          wVar12 = my_stricmp(pmVar24->name,"same");
          pmVar17 = pmVar2;
          if (wVar12 != L'\0') {
            pmVar17 = lookup_monster(pmVar24->name);
          }
          pmVar24->race = pmVar17;
          if (pmVar17 == (monster_race *)0x0) {
            quit_fmt("Couldn\'t find friend named \'%s\' for monster \'%s\'",pmVar24->name,
                     pmVar2->name);
          }
          string_free(pmVar24->name);
        }
        pmVar25 = (monster_shape *)&pmVar2->shapes;
        while (pmVar25 = pmVar25->next, pmVar25 != (monster_shape *)0x0) {
          if (pmVar25->base == (monster_base *)0x0) {
            pmVar17 = lookup_monster(pmVar25->name);
            pmVar25->race = pmVar17;
            if (pmVar17 == (monster_race *)0x0) {
              quit_fmt("Couldn\'t find shape named \'%s\' for monster \'%s\'",pmVar25->name,
                       pmVar2->name);
            }
          }
          string_free(pmVar25->name);
        }
        uVar11 = z_info->r_max;
      }
      l_list = (monster_lore *)mem_zalloc((ulong)uVar11 * 0x70);
      lVar21 = 0x60;
      for (uVar20 = 0; pmVar10 = l_list, uVar20 < z_info->r_max; uVar20 = uVar20 + 1) {
        pvVar16 = mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
        *(void **)(pmVar10->flags + lVar21 + -0x68) = pvVar16;
        pvVar16 = mem_zalloc((ulong)z_info->mon_blows_max);
        *(void **)(pmVar10->flags + lVar21 + -0x20) = pvVar16;
        lVar21 = lVar21 + 0x70;
      }
      parser_destroy(p);
      return 0;
    }
    if ((long)uVar20 < 1) {
      __assert_fail("ridx >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-init.c"
                    ,0x6f1,"errr finish_parse_monster(struct parser *)");
    }
    uVar1 = uVar20 - 1;
    memcpy(r_info + uVar1,puVar13,0xd0);
    pmVar2[uVar1].ridx = (uint)uVar1;
    puVar22 = (undefined8 *)*puVar13;
    pmVar17 = pmVar2 + uVar20;
    if (z_info->r_max <= uVar20) {
      pmVar17 = (monster_race *)0x0;
    }
    pmVar2[uVar1].next = pmVar17;
    pmVar14 = (monster_blow *)mem_zalloc((ulong)z_info->mon_blows_max * 0x30);
    plVar18 = (long *)puVar13[0xf];
    if (plVar18 != (long *)0x0) {
      uVar20 = 0xffffffffffffffff;
      pmVar23 = pmVar14;
      do {
        uVar20 = uVar20 + 1;
        if (z_info->mon_blows_max <= uVar20) break;
        pmVar5 = (monster_blow *)*plVar18;
        pbVar6 = (blow_method_conflict *)plVar18[1];
        pbVar7 = (blow_effect_conflict *)plVar18[2];
        lVar21 = plVar18[3];
        lVar8 = plVar18[4];
        lVar9 = plVar18[5];
        (pmVar23->dice).sides = (int)lVar8;
        (pmVar23->dice).m_bonus = (int)((ulong)lVar8 >> 0x20);
        *(long *)&pmVar23->times_seen = lVar9;
        pmVar23->effect = pbVar7;
        (pmVar23->dice).base = (int)lVar21;
        (pmVar23->dice).dice = (int)((ulong)lVar21 >> 0x20);
        pmVar23->next = pmVar5;
        pmVar23->method = pbVar6;
        pmVar23 = pmVar23 + 1;
        plVar18 = (long *)*plVar18;
      } while (plVar18 != (long *)0x0);
      paVar15 = z_info;
      pmVar23 = pmVar14;
      for (uVar20 = 0; uVar20 < paVar15->mon_blows_max; uVar20 = uVar20 + 1) {
        if (pmVar23->next != (monster_blow *)0x0) {
          pmVar23->next = pmVar23 + 1;
          paVar15 = z_info;
        }
        pmVar23 = pmVar23 + 1;
      }
      p_00 = (undefined8 *)puVar13[0xf];
      while (p_00 != (undefined8 *)0x0) {
        puVar4 = (undefined8 *)*p_00;
        mem_free(p_00);
        p_00 = puVar4;
      }
    }
    r_info[uVar1].blow = pmVar14;
    mem_free(puVar13);
    puVar13 = puVar22;
    uVar20 = uVar1;
  } while( true );
}

Assistant:

static errr finish_parse_monster(struct parser *p) {
	struct monster_race *r, *n;
	size_t i;
	int ridx;

	/* Scan the list for the max id and max blows */
	z_info->r_max = 0;
	z_info->mon_blows_max = 0;
	r = parser_priv(p);
	while (r) {
		int max_blows = 0;
		struct monster_blow *b = r->blow;
		z_info->r_max++;
		while (b) {
			b = b->next;
			max_blows++;
		}
		if (max_blows > z_info->mon_blows_max)
			z_info->mon_blows_max = max_blows;
		r = r->next;
	}

	/* Allocate the direct access list and copy the race records to it */
	r_info = mem_zalloc((z_info->r_max + 1) * sizeof(*r));
	ridx = z_info->r_max - 1;
	for (r = parser_priv(p); r; r = n, ridx--) {
		struct monster_blow *b_new;

		assert(ridx >= 0);

		/* Main record */
		memcpy(&r_info[ridx], r, sizeof(*r));
		r_info[ridx].ridx = ridx;
		n = r->next;
		if (ridx < z_info->r_max - 1)
			r_info[ridx].next = &r_info[ridx + 1];
		else
			r_info[ridx].next = NULL;

		/* Blows */
		b_new = mem_zalloc(z_info->mon_blows_max * sizeof(*b_new));
		if (r->blow) {
			struct monster_blow *b_temp, *b_old = r->blow;

			/* Allocate space and copy */
			for (i = 0; i < z_info->mon_blows_max; i++) {
				memcpy(&b_new[i], b_old, sizeof(*b_old));
				b_old = b_old->next;
				if (!b_old) break;
			}

			/* Make next point correctly */
			for (i = 0; i < z_info->mon_blows_max; i++)
				if (b_new[i].next)
					b_new[i].next = &b_new[i + 1];

			/* Tidy up */
			b_old = r->blow;
			b_temp = b_old;
			while (b_temp) {
				b_temp = b_old->next;
				mem_free(b_old);
				b_old = b_temp;
			}
		}
		r_info[ridx].blow = b_new;

		mem_free(r);
	}
	z_info->r_max += 1;

	/* Convert friend and shape names into race pointers */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		struct monster_friends *f;
		struct monster_shape *s;
		for (f = race->friends; f; f = f->next) {
			if (!my_stricmp(f->name, "same")) {
				f->race = race;
			} else {
				f->race = lookup_monster(f->name);
			}
			if (!f->race) {
				quit_fmt("Couldn't find friend named '%s' for monster '%s'",
						 f->name, race->name);
			}
			string_free(f->name);
		}
		for (s = race->shapes; s; s = s->next) {
			if (!s->base) {
				s->race = lookup_monster(s->name);
				if (!s->race) {
					quit_fmt("Couldn't find shape named '%s' for monster '%s'",
							 s->name, race->name);
				}
			}
			string_free(s->name);
		}
	}

	/* Allocate space for the monster lore */
	l_list = mem_zalloc(z_info->r_max * sizeof(struct monster_lore));
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_lore *l = &l_list[i];
		l->blows = mem_zalloc(z_info->mon_blows_max * sizeof(struct monster_blow));
		l->blow_known = mem_zalloc(z_info->mon_blows_max * sizeof(bool));
	}

	parser_destroy(p);
	return 0;
}